

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdate.cpp
# Opt level: O0

int CVmObjDate::common_parseDate(vm_val_t *retval,uint *oargc,multicaldate_t *cal)

{
  int iVar1;
  vm_obj_id_t vVar2;
  vm_val_t *pvVar3;
  CVmObject *pCVar4;
  vm_date_ext *pvVar5;
  uint *in_RSI;
  vm_val_t *in_RDI;
  multicaldate_t *in_stack_00000050;
  CVmDateLocale *in_stack_00000058;
  vm_val_t *in_stack_00000060;
  CVmObjList *slst;
  int32_t *in_stack_00000070;
  int fi;
  CVmObjList *flst;
  vm_val_t ele;
  CVmObjList *lst;
  int32_t in_stack_00000098;
  int fmt_match_cnt;
  date_parse_string fmt_match [20];
  date_parse_result result;
  int32_t daytime;
  int32_t dayno;
  CVmTimeZone *reftz;
  CVmObjDate *refdate;
  int32_t reftime;
  int32_t refday;
  vm_val_t *custom;
  char *src;
  CVmDateLocale lc;
  uint argc;
  undefined4 in_stack_fffffffffffffc78;
  int32_t iVar6;
  int in_stack_fffffffffffffc7c;
  undefined4 in_stack_fffffffffffffc80;
  int32_t dayno_00;
  int in_stack_fffffffffffffc84;
  vm_val_t *in_stack_fffffffffffffc88;
  int32_t *in_stack_fffffffffffffc90;
  CVmDateLocale *in_stack_fffffffffffffca0;
  date_parse_result *local_338;
  CVmObject *local_330;
  uint local_324;
  int local_314;
  vm_val_t local_308;
  CVmObject *local_2f8;
  int local_2ec;
  date_parse_result local_2e8;
  date_parse_result local_1a8;
  CVmTimeZone *local_88;
  CVmObject *local_80;
  int32_t local_78;
  int32_t local_74;
  vm_val_t *local_70;
  char *local_68;
  uint local_3c;
  vm_val_t *local_28;
  
  if (in_RSI == (uint *)0x0) {
    local_324 = 0;
  }
  else {
    local_324 = *in_RSI;
  }
  local_3c = local_324;
  local_28 = in_RDI;
  if ((common_parseDate(vm_val_t*,unsigned_int*,multicaldate_t*)::desc == '\0') &&
     (iVar1 = __cxa_guard_acquire(&common_parseDate(vm_val_t*,unsigned_int*,multicaldate_t*)::desc),
     iVar1 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&common_parseDate::desc,1,3,0);
    __cxa_guard_release(&common_parseDate(vm_val_t*,unsigned_int*,multicaldate_t*)::desc);
  }
  iVar1 = CVmObject::get_prop_check_argc
                    (in_stack_fffffffffffffc88,
                     (uint *)CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),
                     (CVmNativeCodeDesc *)
                     CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
  if (iVar1 != 0) {
    return 1;
  }
  CVmDateLocale::CVmDateLocale(in_stack_fffffffffffffca0);
  CVmStack::get(0);
  local_68 = vm_val_t::get_as_string
                       ((vm_val_t *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
  if (local_68 == (char *)0x0) {
    err_throw(0);
  }
  local_70 = (vm_val_t *)0x0;
  if ((1 < local_3c) && (pvVar3 = CVmStack::get(1), pvVar3->typ != VM_NIL)) {
    local_70 = CVmStack::get(1);
  }
  if ((local_3c < 3) || (pvVar3 = CVmStack::get(2), pvVar3->typ == VM_NIL)) {
    caldate_t::now(in_stack_fffffffffffffc90,(int32_t *)in_stack_fffffffffffffc88);
    goto LAB_00346de8;
  }
  pvVar3 = CVmStack::get(2);
  if (pvVar3->typ == VM_OBJ) {
    CVmStack::get(2);
    pCVar4 = vm_objp(0);
    iVar1 = (*pCVar4->_vptr_CVmObject[1])(pCVar4,metaclass_reg_);
    if (iVar1 == 0) goto LAB_00346d79;
    CVmStack::get(2);
    local_330 = vm_objp(0);
  }
  else {
LAB_00346d79:
    local_330 = (CVmObject *)0x0;
  }
  local_80 = local_330;
  if (local_330 == (CVmObject *)0x0) {
    err_throw(0);
  }
  pvVar5 = get_ext((CVmObjDate *)local_330);
  local_74 = pvVar5->dayno;
  pvVar5 = get_ext((CVmObjDate *)local_80);
  local_78 = pvVar5->daytime;
LAB_00346de8:
  local_88 = get_tz_arg((uint)((ulong)in_stack_fffffffffffffc88 >> 0x20),
                        (uint)in_stack_fffffffffffffc88);
  date_parse_result::date_parse_result
            ((date_parse_result *)CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),
             (multicaldate_t *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
  local_338 = &local_2e8;
  do {
    date_parse_string::date_parse_string((date_parse_string *)local_338);
    local_338 = (date_parse_result *)&local_338->mm;
  } while (local_338 != &local_1a8);
  local_2ec = 0x14;
  iVar6 = local_74;
  dayno_00 = local_78;
  iVar1 = parse_date_string((int32_t *)flst,in_stack_00000070,(char *)slst,in_stack_00000060,
                            in_stack_00000058,in_stack_00000050,(int32_t)lst,in_stack_00000098,
                            (CVmTimeZone *)fmt_match[0].p,(date_parse_result *)fmt_match[0].len,
                            (date_parse_string *)fmt_match[1].p,(int *)fmt_match[1].len);
  pvVar3 = local_28;
  if (iVar1 == 0) {
    vm_val_t::set_nil(local_28);
  }
  else {
    vVar2 = CVmObjList::create(in_stack_fffffffffffffc84,CONCAT44(in_stack_fffffffffffffc7c,iVar6));
    vm_val_t::set_obj(pvVar3,vVar2);
    CVmStack::push(local_28);
    local_2f8 = vm_objp(0);
    CVmObjList::cons_clear((CVmObjList *)CONCAT44(in_stack_fffffffffffffc84,dayno_00));
    vVar2 = create(in_stack_fffffffffffffc84,dayno_00,in_stack_fffffffffffffc7c);
    vm_val_t::set_obj(&local_308,vVar2);
    CVmObjList::cons_set_element
              ((CVmObjList *)CONCAT44(in_stack_fffffffffffffc84,dayno_00),
               CONCAT44(in_stack_fffffffffffffc7c,iVar6),(vm_val_t *)0x346f81);
    vm_val_t::set_nil(&local_308);
    if (local_1a8.tz != local_88) {
      vVar2 = CVmObjTimeZone::create((CVmTimeZone *)CONCAT44(in_stack_fffffffffffffc84,dayno_00));
      vm_val_t::set_obj(&local_308,vVar2);
    }
    CVmObjList::cons_set_element
              ((CVmObjList *)CONCAT44(in_stack_fffffffffffffc84,dayno_00),
               CONCAT44(in_stack_fffffffffffffc7c,iVar6),(vm_val_t *)0x346fd6);
    vm_val_t::set_nil(&local_308);
    iVar1 = date_parse_result::has_tzofs(&local_1a8);
    if (iVar1 != 0) {
      vm_val_t::set_int(&local_308,local_1a8.tzofs / 1000);
    }
    CVmObjList::cons_set_element
              ((CVmObjList *)CONCAT44(in_stack_fffffffffffffc84,dayno_00),
               CONCAT44(in_stack_fffffffffffffc7c,iVar6),(vm_val_t *)0x34702d);
    vVar2 = CVmObjList::create(in_stack_fffffffffffffc84,CONCAT44(in_stack_fffffffffffffc7c,iVar6));
    vm_val_t::set_obj(&local_308,vVar2);
    CVmObjList::cons_set_element
              ((CVmObjList *)CONCAT44(in_stack_fffffffffffffc84,dayno_00),
               CONCAT44(in_stack_fffffffffffffc7c,iVar6),(vm_val_t *)0x347065);
    vm_objp(0);
    CVmObjList::cons_clear((CVmObjList *)CONCAT44(in_stack_fffffffffffffc84,dayno_00));
    for (local_314 = 0; local_314 < local_2ec; local_314 = local_314 + 1) {
      enlist_str((CVmObjList *)CONCAT44(in_stack_fffffffffffffc84,dayno_00),
                 in_stack_fffffffffffffc7c,(date_parse_string *)0x3470b7);
    }
    vVar2 = CVmObjList::create(in_stack_fffffffffffffc84,CONCAT44(in_stack_fffffffffffffc7c,iVar6));
    vm_val_t::set_obj(&local_308,vVar2);
    CVmObjList::cons_set_element
              ((CVmObjList *)CONCAT44(in_stack_fffffffffffffc84,dayno_00),
               CONCAT44(in_stack_fffffffffffffc7c,iVar6),(vm_val_t *)0x3470f9);
    vm_objp(0);
    CVmObjList::cons_clear((CVmObjList *)CONCAT44(in_stack_fffffffffffffc84,dayno_00));
    enlist_str((CVmObjList *)CONCAT44(in_stack_fffffffffffffc84,dayno_00),in_stack_fffffffffffffc7c,
               (date_parse_string *)0x34712c);
    enlist_str((CVmObjList *)CONCAT44(in_stack_fffffffffffffc84,dayno_00),in_stack_fffffffffffffc7c,
               (date_parse_string *)0x347147);
    enlist_str((CVmObjList *)CONCAT44(in_stack_fffffffffffffc84,dayno_00),in_stack_fffffffffffffc7c,
               (date_parse_string *)0x347162);
    enlist_str((CVmObjList *)CONCAT44(in_stack_fffffffffffffc84,dayno_00),in_stack_fffffffffffffc7c,
               (date_parse_string *)0x34717d);
    enlist_str((CVmObjList *)CONCAT44(in_stack_fffffffffffffc84,dayno_00),in_stack_fffffffffffffc7c,
               (date_parse_string *)0x34719b);
    enlist_str((CVmObjList *)CONCAT44(in_stack_fffffffffffffc84,dayno_00),in_stack_fffffffffffffc7c,
               (date_parse_string *)0x3471b9);
    enlist_str((CVmObjList *)CONCAT44(in_stack_fffffffffffffc84,dayno_00),in_stack_fffffffffffffc7c,
               (date_parse_string *)0x3471d7);
    enlist_str((CVmObjList *)CONCAT44(in_stack_fffffffffffffc84,dayno_00),in_stack_fffffffffffffc7c,
               (date_parse_string *)0x3471f5);
    enlist_str((CVmObjList *)CONCAT44(in_stack_fffffffffffffc84,dayno_00),in_stack_fffffffffffffc7c,
               (date_parse_string *)0x347213);
    enlist_str((CVmObjList *)CONCAT44(in_stack_fffffffffffffc84,dayno_00),in_stack_fffffffffffffc7c,
               (date_parse_string *)0x347231);
    enlist_str((CVmObjList *)CONCAT44(in_stack_fffffffffffffc84,dayno_00),in_stack_fffffffffffffc7c,
               (date_parse_string *)0x34724f);
    enlist_str((CVmObjList *)CONCAT44(in_stack_fffffffffffffc84,dayno_00),in_stack_fffffffffffffc7c,
               (date_parse_string *)0x34726d);
    enlist_str((CVmObjList *)CONCAT44(in_stack_fffffffffffffc84,dayno_00),in_stack_fffffffffffffc7c,
               (date_parse_string *)0x34728b);
    CVmStack::discard();
  }
  CVmStack::discard(local_3c);
  return 1;
}

Assistant:

int CVmObjDate::common_parseDate(VMG_ vm_val_t *retval, uint *oargc,
                                 multicaldate_t *cal)
{
    /* check arguments */
    uint argc = (oargc != 0 ? *oargc : 0);
    static CVmNativeCodeDesc desc(1, 3, FALSE);
    if (get_prop_check_argc(retval, oargc, &desc))
        return TRUE;

    /* set up a locale state interface */
    CVmDateLocale lc Pvmg0_P;

    /* retrieve the string to parse */
    const char *src = G_stk->get(0)->get_as_string(vmg0_);
    if (src == 0)
        err_throw(VMERR_BAD_VAL_BIF);

    /* retrieve the format string/list argument, if present */
    const vm_val_t *custom = 0;
    if (argc >= 2 && G_stk->get(1)->typ != VM_NIL)
        custom = G_stk->get(1);

    /* retrieve the reference date, if present */
    int32_t refday, reftime;
    if (argc >= 3 && G_stk->get(2)->typ != VM_NIL)
    {
        /* get the reference date */
        CVmObjDate *refdate = vm_val_cast(CVmObjDate, G_stk->get(2));
        if (refdate == 0)
            err_throw(VMERR_BAD_TYPE_BIF);

        /* get its contents */
        refday = refdate->get_ext()->dayno;
        reftime = refdate->get_ext()->daytime;
    }
    else
    {
        /* no reference date argument - get the current date and time */
        caldate_t::now(refday, reftime);
    }

    /* retrieve the reference time zone, if present */
    CVmTimeZone *reftz = get_tz_arg(vmg_ 3, argc);

    /* parse the date */
    int32_t dayno, daytime;
    date_parse_result result(cal);
    date_parse_string fmt_match[20];
    int fmt_match_cnt = countof(fmt_match);
    if (parse_date_string(vmg_ dayno, daytime, src, custom, &lc,
                          cal, refday, reftime, reftz, &result,
                          fmt_match, &fmt_match_cnt))
    {
        /* create the return list */
        retval->set_obj(CVmObjList::create(vmg_ FALSE, 5));
        G_stk->push(retval);
        CVmObjList *lst = (CVmObjList *)vm_objp(vmg_ retval->val.obj);
        lst->cons_clear();

        /* element [1] is the return date */
        vm_val_t ele;
        ele.set_obj(CVmObjDate::create(vmg_ FALSE, dayno, daytime));
        lst->cons_set_element(0, &ele);

        /* [2] is the TimeZone object, if applicable */
        ele.set_nil();
        if (result.tz != reftz)
            ele.set_obj(CVmObjTimeZone::create(vmg_ result.tz));
        lst->cons_set_element(1, &ele);

        /* [3] is the fixed timezone offset in seconds, if applicable */
        ele.set_nil();
        if (result.has_tzofs())
            ele.set_int(result.tzofs / 1000);
        lst->cons_set_element(2, &ele);

        /* [4] next is the format string matched */
        ele.set_obj(CVmObjList::create(vmg_ FALSE, fmt_match_cnt));
        lst->cons_set_element(3, &ele);
        CVmObjList *flst = (CVmObjList *)vm_objp(vmg_ ele.val.obj);
        flst->cons_clear();

        /* populate the format string list */
        for (int fi = 0 ; fi < fmt_match_cnt ; ++fi)
            enlist_str(vmg_ flst, fi, fmt_match[fi]);

        /* [5] is a sublist with the source substrings */
        ele.set_obj(CVmObjList::create(vmg_ FALSE, 13));
        lst->cons_set_element(4, &ele);
        CVmObjList *slst = (CVmObjList *)vm_objp(vmg_ ele.val.obj);
        slst->cons_clear();

        /* now add the date component source strings */
        enlist_str(vmg_ slst, 0, result.pera);
        enlist_str(vmg_ slst, 1, result.pyy);
        enlist_str(vmg_ slst, 2, result.pmm);
        enlist_str(vmg_ slst, 3, result.pdd);
        enlist_str(vmg_ slst, 4, result.pdoy);
        enlist_str(vmg_ slst, 5, result.pw);
        enlist_str(vmg_ slst, 6, result.pampm);
        enlist_str(vmg_ slst, 7, result.phh);
        enlist_str(vmg_ slst, 8, result.pmi);
        enlist_str(vmg_ slst, 9, result.pss);
        enlist_str(vmg_ slst, 10, result.pms);
        enlist_str(vmg_ slst, 11, result.punix);
        enlist_str(vmg_ slst, 12, result.ptz);

        /* done with the list gc protection */
        G_stk->discard();
    }
    else
    {
        /* return nil */
        retval->set_nil();
    }

    /* discard arguments */
    G_stk->discard(argc);

    /* handled */
    return TRUE;
}